

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall leveldb::VersionSet::LogAndApply(VersionSet *this,VersionEdit *edit,Mutex *mu)

{
  Logger *info_log;
  bool bVar1;
  Version *this_00;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  ulong uVar4;
  Mutex *in_RCX;
  Status local_290;
  Status local_288;
  string local_280;
  Status local_260;
  Slice local_258;
  undefined1 local_248 [8];
  undefined1 local_240 [8];
  string record;
  string local_210;
  undefined1 local_1e9;
  string local_1e8 [8];
  string new_manifest_file;
  Builder builder;
  Version *v;
  Mutex *mu_local;
  VersionEdit *edit_local;
  VersionSet *this_local;
  Status *s;
  
  if ((mu[1].mu_.super___mutex_base._M_mutex.__size[0x19] & 1U) == 0) {
    VersionEdit::SetLogNumber((VersionEdit *)mu,*(uint64_t *)&(edit->deleted_files_)._M_t._M_impl);
  }
  else {
    if ((mu->mu_).super___mutex_base._M_mutex.__data.__list.__next <
        *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl) {
      __assert_fail("edit->log_number_ >= log_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x30b,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    if ((edit->compact_pointers_).
        super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
        ._M_impl.super__Vector_impl_data._M_start <=
        (pointer)(mu->mu_).super___mutex_base._M_mutex.__data.__list.__next) {
      __assert_fail("edit->log_number_ < next_file_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x30c,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
  }
  if ((mu[1].mu_.super___mutex_base._M_mutex.__size[0x1a] & 1U) == 0) {
    VersionEdit::SetPrevLogNumber
              ((VersionEdit *)mu,
               *(uint64_t *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header);
  }
  VersionEdit::SetNextFile
            ((VersionEdit *)mu,
             (uint64_t)
             (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  VersionEdit::SetLastSequence
            ((VersionEdit *)mu,
             (SequenceNumber)
             (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = (Version *)operator_new(0xe8);
  Version::Version(this_00,(VersionSet *)edit);
  Builder::Builder((Builder *)((long)&new_manifest_file.field_2 + 8),(VersionSet *)edit,
                   *(Version **)((long)&edit[2].comparator_.field_2 + 8));
  Builder::Apply((Builder *)((long)&new_manifest_file.field_2 + 8),(VersionEdit *)mu);
  Builder::SaveTo((Builder *)((long)&new_manifest_file.field_2 + 8),this_00);
  Builder::~Builder((Builder *)((long)&new_manifest_file.field_2 + 8));
  Finalize((VersionSet *)edit,this_00);
  std::__cxx11::string::string(local_1e8);
  local_1e9 = 0;
  Status::Status((Status *)this);
  if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0)
  {
    if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)0x0) {
      __assert_fail("descriptor_file_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x327,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    DescriptorFileName(&local_210,(string *)&(edit->comparator_)._M_string_length,
                       (uint64_t)
                       (edit->compact_pointers_).
                       super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::operator=(local_1e8,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    VersionEdit::SetNextFile
              ((VersionEdit *)mu,
               (uint64_t)
               (edit->compact_pointers_).
               super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    (**(code **)(**(long **)&edit->comparator_ + 0x20))
              (&stack0xfffffffffffffde8,*(long **)&edit->comparator_,local_1e8,
               &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    Status::operator=((Status *)this,(Status *)&stack0xfffffffffffffde8);
    Status::~Status((Status *)&stack0xfffffffffffffde8);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      p_Var2 = (_Base_ptr)operator_new(0x20);
      log::Writer::Writer((Writer *)p_Var2,
                          (WritableFile *)
                          (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent);
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
      WriteSnapshot((VersionSet *)((long)&record.field_2 + 8),(Writer *)edit);
      Status::operator=((Status *)this,(Status *)((long)&record.field_2 + 8));
      Status::~Status((Status *)((long)&record.field_2 + 8));
    }
  }
  port::Mutex::Unlock(in_RCX);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_240);
    VersionEdit::EncodeTo((VersionEdit *)mu,(string *)local_240);
    p_Var2 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Slice::Slice(&local_258,(string *)local_240);
    log::Writer::AddRecord((Writer *)local_248,(Slice *)p_Var2);
    Status::operator=((Status *)this,(Status *)local_248);
    Status::~Status((Status *)local_248);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (**(code **)(*(long *)(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent + 0x28))(&local_260);
      Status::operator=((Status *)this,&local_260);
      Status::~Status(&local_260);
    }
    bVar1 = Status::ok((Status *)this);
    if (!bVar1) {
      info_log = *(Logger **)(edit->prev_log_number_ + 0x18);
      Status::ToString_abi_cxx11_(&local_280,(Status *)this);
      uVar3 = std::__cxx11::string::c_str();
      Log(info_log,"MANIFEST write: %s\n",uVar3);
      std::__cxx11::string::~string((string *)&local_280);
    }
    std::__cxx11::string::~string((string *)local_240);
  }
  bVar1 = Status::ok((Status *)this);
  if ((bVar1) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    SetCurrentFile((leveldb *)&local_288,*(Env **)&edit->comparator_,
                   (string *)&(edit->comparator_)._M_string_length,
                   (uint64_t)
                   (edit->compact_pointers_).
                   super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    Status::operator=((Status *)this,&local_288);
    Status::~Status(&local_288);
  }
  port::Mutex::Lock(in_RCX);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    AppendVersion((VersionSet *)edit,this_00);
    *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl =
         (mu->mu_).super___mutex_base._M_mutex.__data.__list.__next;
    *(long *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header =
         mu[1].mu_.super___mutex_base._M_mutex.__align;
  }
  else {
    if (this_00 != (Version *)0x0) {
      Version::~Version(this_00);
      operator_delete(this_00);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      p_Var2 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var2 != (_Base_ptr)0x0) {
        log::Writer::~Writer((Writer *)p_Var2);
        operator_delete(p_Var2);
      }
      p_Var2 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var2 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var2 + 8))();
      }
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (**(code **)(**(long **)&edit->comparator_ + 0x40))
                (&local_290,*(long **)&edit->comparator_,local_1e8);
      Status::~Status(&local_290);
    }
  }
  local_1e9 = 1;
  std::__cxx11::string::~string(local_1e8);
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::LogAndApply(VersionEdit* edit, port::Mutex* mu) {
  if (edit->has_log_number_) {
    assert(edit->log_number_ >= log_number_);
    assert(edit->log_number_ < next_file_number_);
  } else {
    edit->SetLogNumber(log_number_);
  }

  if (!edit->has_prev_log_number_) {
    edit->SetPrevLogNumber(prev_log_number_);
  }

  edit->SetNextFile(next_file_number_);
  edit->SetLastSequence(last_sequence_);

  Version* v = new Version(this);
  {
    Builder builder(this, current_);
    builder.Apply(edit);
    builder.SaveTo(v);
  }
  Finalize(v);

  // Initialize new descriptor log file if necessary by creating
  // a temporary file that contains a snapshot of the current version.
  std::string new_manifest_file;
  Status s;
  if (descriptor_log_ == nullptr) {
    // No reason to unlock *mu here since we only hit this path in the
    // first call to LogAndApply (when opening the database).
    assert(descriptor_file_ == nullptr);
    new_manifest_file = DescriptorFileName(dbname_, manifest_file_number_);
    edit->SetNextFile(next_file_number_);
    s = env_->NewWritableFile(new_manifest_file, &descriptor_file_);
    if (s.ok()) {
      descriptor_log_ = new log::Writer(descriptor_file_);
      s = WriteSnapshot(descriptor_log_);
    }
  }

  // Unlock during expensive MANIFEST log write
  {
    mu->Unlock();

    // Write new record to MANIFEST log
    if (s.ok()) {
      std::string record;
      edit->EncodeTo(&record);
      s = descriptor_log_->AddRecord(record);
      if (s.ok()) {
        s = descriptor_file_->Sync();
      }
      if (!s.ok()) {
        Log(options_->info_log, "MANIFEST write: %s\n", s.ToString().c_str());
      }
    }

    // If we just created a new descriptor file, install it by writing a
    // new CURRENT file that points to it.
    if (s.ok() && !new_manifest_file.empty()) {
      s = SetCurrentFile(env_, dbname_, manifest_file_number_);
    }

    mu->Lock();
  }

  // Install the new version
  if (s.ok()) {
    AppendVersion(v);
    log_number_ = edit->log_number_;
    prev_log_number_ = edit->prev_log_number_;
  } else {
    delete v;
    if (!new_manifest_file.empty()) {
      delete descriptor_log_;
      delete descriptor_file_;
      descriptor_log_ = nullptr;
      descriptor_file_ = nullptr;
      env_->RemoveFile(new_manifest_file);
    }
  }

  return s;
}